

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O1

void __thiscall Sms_Apu::write_data(Sms_Apu *this,blip_time_t time,int data)

{
  uint uVar1;
  int *piVar2;
  
  run_until(this,time);
  if ((char)data < '\0') {
    this->latch = data;
  }
  uVar1 = (uint)this->latch >> 5 & 3;
  if ((this->latch & 0x10U) == 0) {
    if (uVar1 == 3) {
      piVar2 = noise_periods + (data & 3U);
      if ((data & 3U) == 3) {
        piVar2 = &this->squares[2].period;
      }
      (this->noise).period = piVar2;
      (this->noise).feedback = (&this->noise_feedback)[(data & 4U) == 0];
      (this->noise).shifter = 0x8000;
    }
    else {
      piVar2 = &this->squares[uVar1].period;
      if ((char)data < '\0') {
        *piVar2 = (data & 0xfU) << 4 | *piVar2 & 0xff00U;
      }
      else {
        *piVar2 = (data & 0x3fU) << 8 | *piVar2 & 0xffU;
      }
    }
  }
  else {
    this->oscs[uVar1]->volume = (uint)"@2\'\x1f\x18\x13\x0f\f\t\a\x05\x04\x03\x02\x01"[data & 0xf];
  }
  return;
}

Assistant:

void Sms_Apu::write_data( blip_time_t time, int data )
{
	require( (unsigned) data <= 0xFF );
	
	run_until( time );
	
	if ( data & 0x80 )
		latch = data;
	
	int index = (latch >> 5) & 3;
	if ( latch & 0x10 )
	{
		oscs [index]->volume = volumes [data & 15];
	}
	else if ( index < 3 )
	{
		Sms_Square& sq = squares [index];
		if ( data & 0x80 )
			sq.period = (sq.period & 0xFF00) | (data << 4 & 0x00FF);
		else
			sq.period = (sq.period & 0x00FF) | (data << 8 & 0x3F00);
	}
	else
	{
		int select = data & 3;
		if ( select < 3 )
			noise.period = &noise_periods [select];
		else
			noise.period = &squares [2].period;
		
		noise.feedback = (data & 0x04) ? noise_feedback : looped_feedback;
		noise.shifter = 0x8000;
	}
}